

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int eval_relative_location_path
              (lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,int all_desc,
              lyxp_set *set,int options)

{
  uint32_t uVar1;
  LYS_NODE LVar2;
  lyd_node *plVar3;
  lyxp_expr *plVar4;
  ushort uVar5;
  ushort uVar6;
  lyxp_set_type lVar7;
  int iVar8;
  lys_module *plVar9;
  lys_module *plVar10;
  char *pcVar11;
  lyxp_set *plVar12;
  ulong uVar13;
  char *pcVar14;
  lys_node *plVar15;
  lys_node *node;
  lys_node *plVar16;
  lys_module *plVar17;
  undefined4 uVar18;
  lyxp_token lVar19;
  long lVar20;
  uint *puVar21;
  lyxp_node_type pos;
  char *pcVar22;
  lyxp_node_type *plVar23;
  lyxp_set_node *plVar24;
  uint uVar25;
  lyd_node *plVar26;
  lyxp_set *plVar27;
  LY_ECODE ecode;
  ly_ctx *plVar28;
  lys_module *plVar29;
  undefined8 uVar30;
  lyxp_node_type lVar31;
  lyxp_node_type lVar32;
  uint uVar33;
  long lVar34;
  ushort *exp_idx_00;
  bool bVar35;
  bool bVar36;
  lys_module *local_a8;
  lyxp_node_type local_9c;
  ushort *local_98;
  lys_module *local_90;
  lys_module *local_88;
  lyxp_expr *local_80;
  lys_module *local_78;
  lyxp_node_type local_6c;
  uint uStack_68;
  uint32_t mod_idx;
  lys_module *local_60;
  lys_module *local_58;
  char local_49;
  lys_node *local_48;
  lys_module *local_40;
  lyxp_set *local_38;
  
  pcVar14 = (char *)(ulong)(uint)all_desc;
  pcVar22 = "parsed";
  if (set == (lyxp_set *)0x0) {
    pcVar22 = "skipped";
  }
  local_49 = (options & 0x1cU) == 0 || set == (lyxp_set *)0x0;
  uVar5 = *exp_idx;
  local_98 = exp_idx;
  local_88 = param_4;
  local_80 = exp;
  local_48 = (lys_node *)cur_node;
  local_38 = set;
LAB_00179693:
  plVar27 = local_38;
  uVar33 = (uint)set;
  uVar13 = (ulong)uVar5;
  lVar19 = exp->tokens[uVar13];
  switch(lVar19) {
  case LYXP_TOKEN_DOT:
    if (local_38 != (lyxp_set *)0x0) {
      if ((options & 0x1cU) == 0) {
        lVar7 = moveto_self(local_38,(lyd_node *)local_48,all_desc,options);
      }
      else {
        lVar7 = moveto_snode_self(local_38,local_48,all_desc,options);
      }
      goto switchD_00179c2f_caseD_0;
    }
    lVar19 = LYXP_TOKEN_DOT;
LAB_00179b88:
    pcVar14 = "skipped";
    goto LAB_0017a38a;
  case LYXP_TOKEN_DDOT:
    if (local_38 == (lyxp_set *)0x0) {
      lVar19 = LYXP_TOKEN_DDOT;
      goto LAB_00179b88;
    }
    if ((options & 0x1cU) != 0) {
      lVar7 = local_38->type;
      if (lVar7 == LYXP_SET_EMPTY) goto switchD_00179c2f_caseD_0;
      if (lVar7 == LYXP_SET_SNODE_SET) {
        if (all_desc != 0) {
          iVar8 = moveto_snode_self(local_38,local_48,1,options);
          lVar7 = ~LYXP_SET_EMPTY;
          if (iVar8 != 0) goto switchD_00179c2f_caseD_0;
        }
        plVar29 = (lys_module *)moveto_snode_get_root(local_48,options,&local_6c);
        uVar1 = plVar27->used;
        lVar20 = (long)(int)uVar1;
        lVar7 = LYXP_SET_EMPTY;
        if (0 < lVar20) {
          uVar30 = CONCAT71((int7)((ulong)plVar29 >> 8),1);
          lVar34 = 0;
          local_40 = plVar29;
LAB_0017973e:
          local_60 = (lys_module *)CONCAT44(local_60._4_4_,(int)uVar30);
          do {
            if ((plVar27->val).nodes[lVar34].pos == 1) {
              (plVar27->val).nodes[lVar34].pos = 0;
              if ((plVar27->val).nodes[lVar34].type == LYXP_NODE_ELEM) {
                plVar29 = (lys_module *)(plVar27->val).nodes[lVar34].node;
                plVar9 = plVar29;
                do {
                  plVar9 = (lys_module *)lys_parent((lys_node *)plVar9);
                  if (plVar9 == (lys_module *)0x0) {
                    if (local_40 == plVar29) goto LAB_00179837;
                    if (((options & 0x18U) == 0) || (uVar18 = 1, (local_48->flags & 1) == 0)) {
                      uVar18 = 0;
                    }
                    local_58 = (lys_module *)CONCAT44(local_58._4_4_,uVar18);
                    plVar29 = lys_node_module((lys_node *)plVar29);
                    plVar29 = (lys_module *)
                              lys_getnext((lys_node *)0x0,(lys_node *)0x0,plVar29,0x100);
                    if (plVar29 != local_40) {
                      ly_log(local_48->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                             ,0x1972);
                    }
                    plVar9 = local_40;
                    lVar31 = (lyxp_node_type)local_58;
                    goto LAB_0017984e;
                  }
                } while (((ulong)plVar9->filepath & 0x1642) != 0);
                if (local_40 == plVar29) {
LAB_00179837:
                  if (((options & 0x18U) == 0) ||
                     (plVar9 = plVar29, lVar31 = LYXP_NODE_ROOT_CONFIG, (local_48->flags & 1) == 0))
                  {
                    plVar9 = plVar29;
                    lVar31 = LYXP_NODE_ROOT;
                  }
LAB_0017984e:
                  if ((lVar31 != local_6c) || (plVar9 != local_40)) {
                    __assert_fail("(new_type == LYXP_NODE_ELEM) || ((new_type == root_type) && (new_node == root))"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                                  ,0x197c,
                                  "int moveto_snode_parent(struct lyxp_set *, struct lys_node *, int, int)"
                                 );
                  }
                }
                else {
                  lVar31 = LYXP_NODE_ELEM;
                }
                plVar27 = local_38;
                iVar8 = set_snode_insert_node(local_38,(lys_node *)plVar9,lVar31);
                if (iVar8 < (int)uVar1 && lVar34 < iVar8) goto LAB_00179892;
              }
            }
            lVar34 = lVar34 + 1;
            if (lVar34 == lVar20) {
              if (((ulong)local_60 & 1) == 0) goto LAB_0017a307;
              break;
            }
          } while( true );
        }
        goto switchD_00179c2f_caseD_0;
      }
      if (lVar7 - LYXP_SET_NODE_SET < 5) {
        pcVar11 = *(char **)(&DAT_001ccd40 + (ulong)(lVar7 - LYXP_SET_NODE_SET) * 8);
      }
      else {
        pcVar11 = (char *)0x0;
      }
      plVar28 = local_48->module->ctx;
      goto LAB_0017a34a;
    }
    plVar28 = (ly_ctx *)**(undefined8 **)(local_48->name + 0x30);
    pcVar11 = "schema node set";
    lVar7 = local_38->type;
    switch(local_38->type) {
    case LYXP_SET_EMPTY:
      goto switchD_00179c2f_caseD_0;
    case LYXP_SET_NODE_SET:
      if ((all_desc == 0) ||
         (lVar7 = moveto_self(local_38,(lyd_node *)local_48,1,options), lVar7 == LYXP_SET_EMPTY)) {
        local_40 = (lys_module *)moveto_get_root((lyd_node *)local_48,options,&local_6c);
        plVar27 = local_38;
        if (local_38->used != 0) {
          uVar13 = 0;
          local_58 = (lys_module *)CONCAT44(local_58._4_4_,local_6c);
          do {
            lVar31 = (lyxp_node_type)uVar13;
            plVar12 = plVar27;
            while( true ) {
              plVar27 = local_38;
              plVar29 = (lys_module *)(plVar12->val).nodes[uVar13].node;
              lVar32 = (plVar12->val).nodes[uVar13].type;
              if (lVar32 == LYXP_NODE_ATTR) break;
              plVar9 = plVar29;
              if (lVar32 == LYXP_NODE_TEXT) goto LAB_00179cdf;
              if (lVar32 == LYXP_NODE_ELEM) {
                plVar9 = (lys_module *)plVar29->org;
                goto LAB_00179cdf;
              }
              set_remove_node(local_38,lVar31);
              plVar12 = plVar27;
              if (plVar27->used <= lVar31) goto LAB_00179e0f;
            }
            plVar9 = (lys_module *)lyd_attr_parent((lyd_node *)local_40,(lyd_attr *)plVar29);
            if (plVar9 == (lys_module *)0x0) {
              ly_log(plVar28,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                     ,0x18f8);
              goto LAB_0017a361;
            }
LAB_00179cdf:
            if ((((options & 2U) != 0) && (plVar9 != (lys_module *)0x0)) &&
               (((ulong)plVar9->name & 0xe00) == 0x800)) {
              lVar7 = LYXP_SET_NODE_SET;
              goto switchD_00179c2f_caseD_0;
            }
            if (local_40 == plVar29) {
              if ((options == 0) ||
                 (lVar32 = LYXP_NODE_ROOT_CONFIG, plVar9 = plVar29, (local_48->name[0x18] & 1U) == 0
                 )) {
                lVar32 = LYXP_NODE_ROOT;
                plVar9 = plVar29;
              }
LAB_00179daa:
              pos = (lyxp_node_type)local_58;
              if ((lVar32 != (lyxp_node_type)local_58) || (plVar9 != local_40)) {
                __assert_fail("(new_type == LYXP_NODE_ELEM) || ((new_type == root_type) && (new_node == root))"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                              ,0x1923,
                              "int moveto_parent(struct lyxp_set *, struct lyd_node *, int, int)");
              }
              iVar8 = set_dup_node_check(local_38,(lyd_node *)plVar9,(lyxp_node_type)local_58,-1);
            }
            else {
              if (plVar9 == (lys_module *)0x0) {
                if ((options == 0) ||
                   (lVar32 = LYXP_NODE_ROOT_CONFIG, (local_48->name[0x18] & 1U) == 0)) {
                  lVar32 = LYXP_NODE_ROOT;
                }
                do {
                  plVar10 = plVar29;
                  plVar29 = (lys_module *)plVar10->ref;
                } while (plVar29->dsc != (char *)0x0);
                plVar9 = local_40;
                if (plVar10 != local_40) {
                  pcVar14 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                  ;
                  ly_log(plVar28,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                         ,0x1919);
                  plVar9 = local_40;
                }
                goto LAB_00179daa;
              }
              iVar8 = set_dup_node_check(local_38,(lyd_node *)plVar9,LYXP_NODE_ELEM,-1);
              pos = LYXP_NODE_ELEM;
            }
            plVar27 = local_38;
            if (iVar8 == 0) {
              set_replace_node(local_38,(lyd_node *)plVar9,pos,lVar31,(uint32_t)pcVar14);
              uVar13 = (ulong)(lVar31 + LYXP_NODE_ROOT_CONFIG);
            }
            else {
              set_remove_node(local_38,lVar31);
            }
          } while ((uint)uVar13 < plVar27->used);
        }
LAB_00179e0f:
        iVar8 = set_sort(plVar27,(lyd_node *)local_48,options);
        if (iVar8 != 0) {
LAB_0017b187:
          __assert_fail("!set_sort(set, cur_node, options) && !set_sorted_dup_node_clean(set)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x192d,"int moveto_parent(struct lyxp_set *, struct lyd_node *, int, int)")
          ;
        }
        uVar33 = local_38->used;
        lVar7 = LYXP_SET_EMPTY;
        if (1 < uVar33) {
          bVar35 = true;
          uVar13 = 0;
          do {
            plVar27 = local_38;
            uVar13 = uVar13 & 0xffffffff;
            plVar23 = &((local_38->val).nodes + uVar13)[1].type;
            plVar26 = (local_38->val).nodes[uVar13].node;
            while ((plVar24 = (lyxp_set_node *)(plVar23 + -2), plVar26 != plVar24->node ||
                   (plVar23[-4] != *plVar23))) {
              uVar13 = uVar13 + 1;
              plVar23 = plVar23 + 4;
              plVar26 = plVar24->node;
              if (uVar33 - 1 <= uVar13) {
                if (bVar35) goto switchD_00179c2f_caseD_0;
                goto LAB_0017b187;
              }
            }
            set_remove_node(local_38,(uint)uVar13 + 1);
            uVar33 = plVar27->used;
            bVar35 = false;
          } while ((uint)uVar13 < uVar33 - 1);
          goto LAB_0017b187;
        }
      }
      goto switchD_00179c2f_caseD_0;
    case LYXP_SET_SNODE_SET:
      break;
    case LYXP_SET_BOOLEAN:
      pcVar11 = "boolean";
      break;
    case LYXP_SET_NUMBER:
      pcVar11 = "number";
      break;
    case LYXP_SET_STRING:
      pcVar11 = "string";
      break;
    default:
      pcVar11 = (char *)0x0;
    }
LAB_0017a34a:
    ly_vlog(plVar28,LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar11);
LAB_0017a361:
    lVar7 = ~LYXP_SET_EMPTY;
    goto switchD_00179c2f_caseD_0;
  case LYXP_TOKEN_AT:
    uVar33 = (uint)exp->expr_pos[uVar13];
    bVar35 = false;
    ly_log_dbg(8,"%-27s %s %s[%u]","eval_relative_location_path",pcVar22);
    uVar5 = *exp_idx;
    *exp_idx = uVar5 + 1;
    uVar13 = (ulong)(ushort)(uVar5 + 1);
    lVar19 = exp->tokens[uVar13];
    break;
  default:
    if (local_88 == (lys_module *)0x0) {
      plVar28 = (ly_ctx *)0x0;
    }
    else {
      plVar28 = local_88->ctx;
    }
    uVar30 = 0x1c47;
LAB_0017afb7:
    ly_log(plVar28,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
           ,uVar30);
    return ~LYXP_SET_EMPTY;
  case LYXP_TOKEN_NAMETEST:
  case LYXP_TOKEN_NODETYPE:
    bVar35 = true;
  }
  plVar27 = local_38;
  if (lVar19 == LYXP_TOKEN_NODETYPE) {
    local_40 = (lys_module *)0x1ba505;
    if (local_38 != (lyxp_set *)0x0) {
      if (local_80->tok_len[uVar13] != 4) {
        __assert_fail("exp->tok_len[*exp_idx] == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0x1b0e,
                      "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                     );
      }
      lVar7 = local_38->type;
      if (lVar7 == LYXP_SET_SNODE_SET) {
        uVar33 = local_38->used;
        local_40 = (lys_module *)0x1ba505;
        if ((ulong)uVar33 != 0) {
          lVar20 = 0;
          do {
            if (*(int *)((long)&((local_38->val).nodes)->pos + lVar20) == 1) {
              *(undefined4 *)((long)&((local_38->val).nodes)->pos + lVar20) = 0;
            }
            lVar20 = lVar20 + 0x10;
          } while ((ulong)uVar33 << 4 != lVar20);
          local_40 = (lys_module *)0x1ba505;
        }
      }
      else {
        uVar5 = local_80->expr_pos[uVar13];
        pcVar14 = local_80->expr;
        iVar8 = strncmp(pcVar14 + uVar5,"node",4);
        if (iVar8 == 0) {
          if ((options & 0x1cU) == 0) {
            local_40 = (lys_module *)0x1a0dcf;
            if (lVar7 != LYXP_SET_NODE_SET) {
              lyxp_set_cast(plVar27,LYXP_SET_EMPTY,(lyd_node *)local_48,local_88,options);
              goto LAB_0017a21d;
            }
          }
          else {
            uVar33 = plVar27->used;
            local_40 = (lys_module *)0x1a0dcf;
            if ((ulong)uVar33 != 0) {
              lVar20 = 0;
              do {
                if (*(int *)((long)&((plVar27->val).nodes)->pos + lVar20) == 1) {
                  *(undefined4 *)((long)&((plVar27->val).nodes)->pos + lVar20) = 0;
                }
                lVar20 = lVar20 + 0x10;
              } while ((ulong)uVar33 << 4 != lVar20);
LAB_0017a21d:
              local_40 = (lys_module *)0x1a0dcf;
            }
          }
        }
        else {
          iVar8 = strncmp(pcVar14 + uVar5,"text",4);
          if (iVar8 != 0) {
            __assert_fail("!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], \"text\", 4)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                          ,0x1b19,
                          "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                         );
          }
          if ((options & 0x1cU) == 0) {
            local_40 = (lys_module *)0x1a0dcf;
            if (lVar7 != LYXP_SET_EMPTY) {
              if (lVar7 != LYXP_SET_NODE_SET) {
                plVar28 = local_88->ctx;
                if (lVar7 - LYXP_SET_BOOLEAN < 3) {
                  pcVar22 = &DAT_001b9e58 +
                            *(int *)(&DAT_001b9e58 + (ulong)(lVar7 - LYXP_SET_BOOLEAN) * 4);
                }
                else {
                  pcVar22 = (char *)0x0;
                }
                pcVar14 = "text()";
                ecode = LYE_XPATH_INCTX;
                goto LAB_0017b094;
              }
              uVar33 = plVar27->used;
              local_40 = (lys_module *)0x1a0dcf;
              if (uVar33 != 0) {
                uVar13 = 0;
                do {
                  lVar31 = (plVar27->val).nodes[uVar13].type;
                  if (lVar31 < (LYXP_NODE_ATTR|LYXP_NODE_ROOT_CONFIG)) {
                    if (lVar31 == LYXP_NODE_ELEM) {
                      plVar24 = (plVar27->val).nodes + uVar13;
                      plVar26 = plVar24->node;
                      if ((char)plVar26->validity < '\0') {
                        ly_vlog(local_88->ctx,LYE_XPATH_DUMMY,LY_VLOG_LYD,plVar26,
                                plVar26->schema->name);
                        return ~LYXP_SET_EMPTY;
                      }
                      if (((plVar26->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
                         (plVar26->ht != (hash_table *)0x0)) {
                        plVar24->type = LYXP_NODE_TEXT;
                        uVar13 = (ulong)((uint32_t)uVar13 + 1);
                        goto LAB_0017a1ac;
                      }
                    }
                    set_remove_node(plVar27,(uint32_t)uVar13);
                    uVar33 = plVar27->used;
                  }
LAB_0017a1ac:
                } while ((uint)uVar13 < uVar33);
                goto LAB_0017a21d;
              }
            }
          }
          else {
            uVar33 = plVar27->used;
            local_40 = (lys_module *)0x1a0dcf;
            if ((ulong)uVar33 != 0) {
              lVar20 = 0;
              do {
                if (*(int *)((long)&((plVar27->val).nodes)->pos + lVar20) == 1) {
                  *(undefined4 *)((long)&((plVar27->val).nodes)->pos + lVar20) = 0;
                }
                lVar20 = lVar20 + 0x10;
              } while ((ulong)uVar33 << 4 != lVar20);
              goto LAB_0017a21d;
            }
          }
        }
      }
    }
    plVar4 = local_80;
    exp_idx_00 = local_98;
    pcVar14 = print_token(local_80->tokens[*local_98]);
    ly_log_dbg(8,"%-27s %s %s[%u]","eval_node_test",local_40,pcVar14,
               (ulong)plVar4->expr_pos[*exp_idx_00]);
    uVar5 = *exp_idx_00 + 1;
    *exp_idx_00 = uVar5;
    if (plVar4->tokens[uVar5] != LYXP_TOKEN_PAR1) {
      __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_PAR1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x1b25,
                    "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                   );
    }
    ly_log_dbg(8,"%-27s %s %s[%u]","eval_node_test",local_40,"(",(ulong)plVar4->expr_pos[uVar5]);
    uVar5 = *exp_idx_00 + 1;
    *exp_idx_00 = uVar5;
    if (plVar4->tokens[uVar5] != LYXP_TOKEN_PAR2) {
      __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_PAR2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x1b2b,
                    "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                   );
    }
    ly_log_dbg(8,"%-27s %s %s[%u]","eval_node_test",local_40,")",(ulong)plVar4->expr_pos[uVar5]);
  }
  else {
    if (lVar19 != LYXP_TOKEN_NAMETEST) {
      if (local_88 == (lys_module *)0x0) {
        plVar28 = (ly_ctx *)0x0;
      }
      else {
        plVar28 = local_88->ctx;
      }
      uVar30 = 0x1b32;
      goto LAB_0017afb7;
    }
    if (bVar35) {
      uVar13 = (ulong)(uint)((int)uVar13 * 2);
      plVar29 = (lys_module *)(local_80->expr + *(ushort *)((long)local_80->expr_pos + uVar13));
      uVar5 = *(ushort *)((long)local_80->tok_len + uVar13);
      uVar13 = (ulong)uVar5;
      uVar33 = (uint)uVar5;
      if (all_desc == 0) {
        if (local_49 == '\0') {
          lVar7 = LYXP_SET_EMPTY;
          if (local_38->type != LYXP_SET_EMPTY) {
            plVar9 = (lys_module *)local_48->module->ctx;
            pcVar14 = "node set";
            _uStack_68 = plVar9;
            switch(local_38->type) {
            case LYXP_SET_NODE_SET:
              break;
            case LYXP_SET_SNODE_SET:
              moveto_snode_get_root(local_48,options,&local_9c);
              iVar8 = (int)pcVar14;
              local_78 = plVar29;
              pcVar14 = strnchr((char *)plVar29,0x3a,(uint)uVar5);
              plVar27 = local_38;
              plVar9 = _uStack_68;
              plVar29 = local_78;
              if (pcVar14 == (char *)0x0) {
                if ((uVar5 == 1) && (*(char *)&local_78->ctx == '*')) {
                  uVar13 = 1;
                  local_60 = (lys_module *)0x0;
                }
                else {
                  local_60 = lys_node_module(local_48);
                }
              }
              else {
                uVar25 = (int)pcVar14 - (int)local_78;
                plVar10 = moveto_resolve_model
                                    ((char *)local_78,(uint16_t)uVar25,(ly_ctx *)_uStack_68,local_48
                                     ,1,iVar8);
                if (plVar10 == (lys_module *)0x0) goto LAB_0017abc5;
                plVar29 = (lys_module *)(local_78->padding2 + (long)(int)uVar25 + -0x41);
                uVar13 = (ulong)(~uVar25 + (uint)uVar5);
                plVar27 = local_38;
                local_60 = plVar10;
              }
              plVar9 = _uStack_68;
              pcVar14 = lydict_insert((ly_ctx *)_uStack_68,(char *)plVar29,uVar13 & 0xffff);
              local_40 = (lys_module *)(long)(int)plVar27->used;
              if ((long)local_40 < 1) {
                lydict_remove((ly_ctx *)plVar9,pcVar14);
                lVar7 = LYXP_SET_EMPTY;
              }
              else {
                plVar9 = (lys_module *)0x0;
                local_58 = (lys_module *)((ulong)local_58 & 0xffffffff00000000);
                plVar29 = local_60;
                do {
                  plVar16 = local_48;
                  if ((plVar27->val).nodes[(long)plVar9].pos == 1) {
                    (plVar27->val).nodes[(long)plVar9].pos = 0;
                    if ((plVar27->val).nodes[(long)plVar9].type < LYXP_NODE_ELEM) {
                      local_6c = LYXP_NODE_ROOT;
                      plVar10 = plVar29;
                      do {
                        plVar29 = plVar10;
                        if ((plVar29 == (lys_module *)0x0) &&
                           (plVar29 = ly_ctx_get_module_iter((ly_ctx *)_uStack_68,&local_6c),
                           plVar29 == (lys_module *)0x0)) {
                          plVar29 = (lys_module *)0x0;
                          break;
                        }
                        plVar16 = lys_getnext((lys_node *)0x0,(lys_node *)0x0,plVar29,0x100);
                        plVar27 = local_38;
                        while (local_38 = plVar27, plVar16 != (lys_node *)0x0) {
                          iVar8 = moveto_snode_check(plVar16,local_9c,pcVar14,plVar29,options);
                          if (iVar8 == 0) {
                            iVar8 = set_snode_insert_node(local_38,plVar16,LYXP_NODE_ELEM);
                            if ((long)plVar9 < (long)iVar8 && iVar8 < (int)local_40) {
                              (local_38->val).nodes[iVar8].pos = 2;
                              local_58 = (lys_module *)CONCAT44(local_58._4_4_,1);
                            }
                          }
                          plVar16 = lys_getnext(plVar16,(lys_node *)0x0,plVar29,0x100);
                          plVar27 = local_38;
                        }
                        plVar10 = (lys_module *)0x0;
                      } while (local_6c != LYXP_NODE_ROOT);
                    }
                    else {
                      plVar10 = (lys_module *)(plVar27->val).nodes[(long)plVar9].node;
                      if (((ulong)plVar10->filepath & 0x802c) == 0) {
                        local_78 = plVar10;
                        local_60 = plVar29;
                        if (plVar29 == (lys_module *)0x0) {
                          plVar29 = lys_node_module(local_48);
                          if ((plVar29->field_0x40 & 0x80) == 0) {
                            plVar17 = lys_node_module(plVar16);
                            plVar10 = (lys_module *)0x0;
                            goto LAB_0017adb9;
                          }
                          local_a8 = (lys_module *)0x0;
                          plVar10 = (lys_module *)0x0;
                        }
                        else {
                          plVar10 = (lys_module *)0x0;
                          local_a8 = (lys_module *)0x0;
                          plVar17 = plVar29;
                          if ((plVar29->field_0x40 & 0x80) == 0) goto LAB_0017adb9;
                        }
                        while( true ) {
                          plVar17 = plVar10;
                          if (plVar10 == (lys_module *)0x0) {
                            plVar17 = local_78;
                          }
                          local_90 = plVar10;
                          plVar16 = lys_getnext((lys_node *)0x0,(lys_node *)plVar17,
                                                (lys_module *)0x0,0x100);
                          lVar31 = local_9c;
                          plVar10 = local_90;
                          plVar29 = local_60;
                          while (local_9c = lVar31, local_90 = plVar10, local_60 = plVar29,
                                plVar16 != (lys_node *)0x0) {
                            if (plVar29 == (lys_module *)0x0) {
                              plVar29 = lys_node_module(local_48);
                            }
                            iVar8 = moveto_snode_check(plVar16,lVar31,pcVar14,plVar29,options);
                            plVar27 = local_38;
                            if (iVar8 == 0) {
                              iVar8 = set_snode_insert_node(local_38,plVar16,LYXP_NODE_ELEM);
                              if ((long)plVar9 < (long)iVar8 && iVar8 < (int)local_40) {
                                (plVar27->val).nodes[iVar8].pos = 2;
                                local_58 = (lys_module *)CONCAT44(local_58._4_4_,1);
                              }
                            }
                            plVar16 = lys_getnext(plVar16,(lys_node *)plVar17,(lys_module *)0x0,
                                                  0x100);
                            lVar31 = local_9c;
                            plVar10 = local_90;
                            plVar29 = local_60;
                          }
                          plVar17 = local_a8;
                          if (plVar10 == (lys_module *)0x0) break;
LAB_0017adb9:
                          plVar10 = (lys_module *)
                                    lys_getnext_target_aug
                                              ((lys_node_augment *)plVar10,plVar17,
                                               (lys_node *)local_78);
                          local_a8 = plVar17;
                        }
                      }
                    }
                  }
                  plVar9 = (lys_module *)((long)&plVar9->ctx + 1);
                } while (plVar9 != local_40);
                lydict_remove((ly_ctx *)_uStack_68,pcVar14);
                lVar7 = LYXP_SET_EMPTY;
                if ((lyxp_node_type)local_58 != 0) {
                  local_40 = (lys_module *)((long)local_40 << 4);
                  lVar20 = 0;
                  do {
                    if (*(int *)((long)&((plVar27->val).nodes)->pos + lVar20) == 2) {
                      *(undefined4 *)((long)&((plVar27->val).nodes)->pos + lVar20) = 1;
                    }
                    lVar20 = lVar20 + 0x10;
                    lVar7 = LYXP_SET_EMPTY;
                  } while (local_40 != (lys_module *)lVar20);
                }
              }
              goto LAB_0017a679;
            case LYXP_SET_BOOLEAN:
              pcVar14 = "boolean";
              break;
            case LYXP_SET_NUMBER:
              pcVar14 = "number";
              break;
            case LYXP_SET_STRING:
              pcVar14 = "string";
              break;
            default:
              pcVar14 = (char *)0x0;
            }
            goto LAB_0017a656;
          }
        }
        else {
          lVar7 = moveto_node(local_38,(lyd_node *)local_48,(char *)plVar29,uVar5,options);
        }
      }
      else if (local_49 == '\0') {
        if (local_38->type == LYXP_SET_EMPTY) {
          lVar7 = LYXP_SET_EMPTY;
        }
        else {
          plVar9 = (lys_module *)local_48->module->ctx;
          puVar21 = &switchD_00179ef0::switchdataD_001b9d08;
          pcVar14 = "node set";
          switch(local_38->type) {
          case LYXP_SET_NODE_SET:
            break;
          case LYXP_SET_SNODE_SET:
            moveto_snode_get_root(local_48,options,&local_6c);
            iVar8 = (int)pcVar14;
            local_78 = plVar29;
            pcVar14 = strnchr((char *)plVar29,0x3a,(uint)uVar5);
            plVar29 = local_78;
            if (pcVar14 == (char *)0x0) {
              _uStack_68 = (lys_module *)0x0;
            }
            else {
              pcVar14 = strnchr((char *)local_78,0x3a,(uint)uVar5);
              uVar25 = (int)pcVar14 - (int)plVar29;
              plVar10 = moveto_resolve_model
                                  ((char *)plVar29,(uint16_t)uVar25,(ly_ctx *)plVar9,local_48,1,
                                   iVar8);
              if (plVar10 == (lys_module *)0x0) {
LAB_0017abc5:
                ly_vlog((ly_ctx *)plVar9,LYE_XPATH_INMOD,LY_VLOG_NONE,(void *)0x0,(ulong)uVar25,
                        local_78);
                plVar27 = local_38;
                lVar7 = ~LYXP_SET_EMPTY;
                goto LAB_0017a679;
              }
              uVar33 = ~uVar25 + (uint)uVar5;
              plVar29 = (lys_module *)(local_78->padding2 + (long)(int)uVar25 + -0x41);
              puVar21 = (uint *)local_78;
              _uStack_68 = plVar10;
            }
            plVar9 = local_58;
            local_58 = (lys_module *)((ulong)local_58 & 0xffffffff00000000);
            if ((short)uVar33 == 1) {
              local_58._4_4_ = SUB84(plVar9,4);
              local_58 = (lys_module *)
                         CONCAT44(local_58._4_4_,
                                  (int)CONCAT71((int7)((ulong)puVar21 >> 8),
                                                *(char *)&plVar29->ctx == '*'));
            }
            local_40 = (lys_module *)(long)(int)local_38->used;
            plVar27 = local_38;
            lVar7 = LYXP_SET_EMPTY;
            if (0 < (long)local_40) {
              local_60 = (lys_module *)(ulong)(uVar33 & 0xffff);
              plVar9 = (lys_module *)0x0;
              local_78 = plVar29;
              do {
                if ((local_38->val).nodes[(long)plVar9].pos == 1) {
                  (local_38->val).nodes[(long)plVar9].pos = 0;
                  plVar16 = (lys_node *)(local_38->val).nodes[(long)plVar9].node;
                  plVar15 = plVar16;
                  if (plVar16 != (lys_node *)0x0) {
                    do {
                      do {
                        node = plVar15;
                        if ((local_6c == LYXP_NODE_ROOT_CONFIG) && ((node->flags & 2) != 0)) break;
                        LVar2 = node->nodetype;
                        if (0x3ff < (int)LVar2) {
                          if (LVar2 == LYS_OUTPUT) {
                            if ((options & 0x20U) != 0) goto LAB_0017ab0f;
                          }
                          else if (LVar2 != LYS_GROUPING) {
                            if (LVar2 != LYS_USES) goto LAB_0017aa2b;
                            goto LAB_0017ab0f;
                          }
                          break;
                        }
                        if ((LVar2 != LYS_CHOICE) && (LVar2 != LYS_CASE)) {
                          if (LVar2 == LYS_INPUT) {
                            if ((options & 0x20U) != 0) break;
                          }
                          else {
LAB_0017aa2b:
                            bVar35 = node != plVar16;
                            if (bVar35 && (char)local_58 == '\0') {
                              plVar29 = lys_node_module(node);
                              if (_uStack_68 == (lys_module *)0x0) {
                                local_90 = plVar29;
                                plVar29 = lys_node_module(local_48);
                                bVar36 = local_90 == plVar29;
                              }
                              else {
                                bVar36 = plVar29 == _uStack_68;
                              }
                              bVar35 = (bool)(bVar35 & bVar36);
                            }
                            if (bVar35 && (char)local_58 == '\0') {
                              local_90 = (lys_module *)node->name;
                              iVar8 = strncmp((char *)local_90,(char *)local_78,(size_t)local_60);
                              if ((iVar8 == 0) &&
                                 (*(char *)((long)(((lys_module *)
                                                   (((lys_module *)(local_60->padding2 + -0x42))->
                                                    padding2 + -0x42))->padding2 + -0x42) +
                                           (long)((lys_module *)
                                                 (((lys_module *)
                                                  (((lys_module *)(local_90->padding2 + -0x42))->
                                                   padding2 + -0x42))->padding2 + -0x42))->padding2
                                           + 0xffffffffffffffbeU) == '\0')) goto LAB_0017aac5;
                            }
                            else if (bVar35) {
LAB_0017aac5:
                              if ((lys_module *)(ulong)local_38->used != (lys_module *)0x0) {
                                plVar29 = (lys_module *)0x0;
                                do {
                                  if (((plVar29 != plVar9) &&
                                      (plVar24 = (local_38->val).nodes,
                                      (lys_node *)plVar24[(long)plVar29].node == node)) &&
                                     (plVar24[(long)plVar29].type == LYXP_NODE_ELEM)) {
                                    if (-1 < (int)(uint)plVar29) {
                                      plVar29 = (lys_module *)(ulong)((uint)plVar29 & 0x7fffffff);
                                      plVar24[(long)plVar29].pos = 1;
                                      if (plVar29 <= plVar9) goto LAB_0017ab0f;
                                      goto LAB_0017ab34;
                                    }
                                    break;
                                  }
                                  plVar29 = (lys_module *)((long)&plVar29->ctx + 1);
                                } while (plVar29 != (lys_module *)(ulong)local_38->used);
                              }
                              set_snode_insert_node(local_38,node,LYXP_NODE_ELEM);
                            }
                          }
                        }
LAB_0017ab0f:
                        plVar15 = node->child;
                      } while (node->child != (lys_node *)0x0 &&
                               (node->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN
                              );
LAB_0017ab34:
                      if (node == plVar16) break;
                      plVar15 = node->next;
                      while (plVar15 == (lys_node *)0x0) {
                        plVar15 = lys_parent(node);
                        if (plVar15 == plVar16) goto LAB_0017ab84;
                        node = lys_parent(node);
                        plVar15 = node->next;
                      }
                    } while( true );
                  }
                }
LAB_0017ab84:
                plVar9 = (lys_module *)((long)&plVar9->ctx + 1);
                plVar27 = local_38;
                lVar7 = LYXP_SET_EMPTY;
              } while (plVar9 != local_40);
            }
            goto LAB_0017a679;
          case LYXP_SET_BOOLEAN:
            pcVar14 = "boolean";
            break;
          case LYXP_SET_NUMBER:
            pcVar14 = "number";
            break;
          case LYXP_SET_STRING:
            pcVar14 = "string";
            break;
          default:
            pcVar14 = (char *)0x0;
          }
LAB_0017a656:
          ly_vlog((ly_ctx *)plVar9,LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar14
                 );
          lVar7 = ~LYXP_SET_EMPTY;
        }
      }
      else {
        lVar7 = moveto_node_alldesc(local_38,(lyd_node *)local_48,(char *)plVar29,uVar5,options);
      }
LAB_0017a679:
      if ((plVar27 == (lyxp_set *)0x0) || (lVar7 != LYXP_SET_EMPTY)) {
        if (lVar7 != LYXP_SET_EMPTY) {
          return lVar7;
        }
      }
      else if ((options & 0x1cU) != 0) {
        uVar13 = (ulong)local_38->used;
        do {
          uVar13 = uVar13 - 1;
          if ((int)(uint)uVar13 < 0) {
            if (uVar13 == 0xffffffffffffffff) {
              pcVar14 = lys_path(local_48,1);
              uVar5 = *(ushort *)((long)local_80->tok_len + (ulong)((uint)*local_98 * 2));
              uVar6 = *(ushort *)((long)local_80->expr_pos + (ulong)((uint)*local_98 * 2));
              ly_log(local_88->ctx,LY_LLWRN,LY_SUCCESS,
                     "Schema node \"%.*s\" not found (%.*s) with context node \"%s\".",(ulong)uVar5,
                     local_80->expr + uVar6,(ulong)((uint)uVar6 + (uint)uVar5),local_80->expr,
                     pcVar14);
              free(pcVar14);
            }
            break;
          }
        } while ((local_38->val).nodes[(uint)uVar13 & 0x7fffffff].pos == 0);
      }
    }
    else if (local_49 == '\0') {
      uVar33 = local_38->used;
      if ((ulong)uVar33 != 0) {
        lVar20 = 0;
        do {
          if (*(int *)((long)&((local_38->val).nodes)->pos + lVar20) == 1) {
            *(undefined4 *)((long)&((local_38->val).nodes)->pos + lVar20) = 0;
          }
          lVar20 = lVar20 + 0x10;
        } while ((ulong)uVar33 << 4 != lVar20);
      }
    }
    else {
      uVar13 = (ulong)(uint)((int)uVar13 * 2);
      plVar29 = (lys_module *)(local_80->expr + *(ushort *)((long)local_80->expr_pos + uVar13));
      uVar5 = *(ushort *)((long)local_80->tok_len + uVar13);
      uVar25 = (uint)uVar5;
      local_60 = plVar29;
      if (all_desc == 0) {
        if ((local_38 != (lyxp_set *)0x0) && (lVar7 = local_38->type, lVar7 != LYXP_SET_EMPTY)) {
          if (lVar7 != LYXP_SET_NODE_SET) goto LAB_0017afe5;
          pcVar14 = strnchr((char *)plVar29,0x3a,uVar25);
          if (local_48 == (lys_node *)0x0) {
            plVar9 = (lys_module *)0x0;
          }
          else if (pcVar14 == (char *)0x0) {
            plVar9 = (lys_module *)0x0;
          }
          else {
            pcVar14 = strnchr((char *)plVar29,0x3a,uVar25);
            uVar25 = (int)pcVar14 - (int)plVar29;
            plVar9 = moveto_resolve_model
                               ((char *)plVar29,(uint16_t)uVar25,
                                (ly_ctx *)**(undefined8 **)(local_48->name + 0x30),(lys_node *)0x0,0
                                ,uVar33);
            if (plVar9 == (lys_module *)0x0) {
              plVar28 = (ly_ctx *)**(undefined8 **)(local_48->name + 0x30);
              goto LAB_0017b0c1;
            }
            plVar29 = (lys_module *)(plVar29->padding2 + (long)(int)uVar25 + -0x41);
            uVar25 = ~uVar25 + (uint)uVar5;
          }
          local_40 = (lys_module *)CONCAT71(local_40._1_7_,1);
          if ((short)uVar25 == 1) {
            local_40 = (lys_module *)CONCAT71(local_40._1_7_,*(char *)&plVar29->ctx != '*');
          }
          local_60 = plVar29;
          local_58 = plVar9;
          if (local_38->used != 0) {
            _uStack_68 = (lys_module *)(ulong)(uVar25 & 0xffff);
            uVar33 = 0;
            do {
              if ((((local_38->val).nodes[uVar33].type == LYXP_NODE_ELEM) &&
                  (plVar26 = (local_38->val).nodes[uVar33].node, -1 < (char)plVar26->validity)) &&
                 (plVar26 = (lyd_node *)plVar26->attr, plVar26 != (lyd_node *)0x0)) {
                bVar35 = false;
                plVar29 = local_58;
                do {
                  plVar9 = _uStack_68;
                  if ((plVar29 == (lys_module *)0x0) ||
                     (*(lys_module **)&plVar26->attr->value_type == plVar29)) {
                    if ((char)local_40 != '\0') {
                      plVar3 = plVar26->next;
                      iVar8 = strncmp((char *)plVar3,(char *)local_60,(size_t)_uStack_68);
                      plVar29 = local_58;
                      if ((iVar8 != 0) ||
                         (plVar9->padding2[(long)((long)&plVar3[-1].schema + 6)] != '\0'))
                      goto LAB_0017a8ef;
                    }
                    if (bVar35) {
                      set_insert_node(local_38,plVar26,(local_38->val).nodes[uVar33].pos,
                                      LYXP_NODE_ATTR,uVar33 + 1);
                    }
                    else {
                      (local_38->val).nodes[uVar33].node = plVar26;
                      (local_38->val).nodes[uVar33].type = LYXP_NODE_ATTR;
                    }
                    uVar33 = uVar33 + 1;
                    bVar35 = true;
                  }
LAB_0017a8ef:
                  plVar26 = *(lyd_node **)&plVar26->validity;
                } while (plVar26 != (lyd_node *)0x0);
                plVar27 = local_38;
                if (!bVar35) goto LAB_0017a910;
              }
              else {
LAB_0017a910:
                plVar27 = local_38;
                set_remove_node(local_38,uVar33);
              }
            } while (uVar33 < plVar27->used);
          }
        }
      }
      else if ((local_38 != (lyxp_set *)0x0) && (lVar7 = local_38->type, lVar7 != LYXP_SET_EMPTY)) {
        if (lVar7 != LYXP_SET_NODE_SET) {
LAB_0017afe5:
          plVar28 = (ly_ctx *)**(undefined8 **)(local_48->name + 0x30);
          if (lVar7 - LYXP_SET_SNODE_SET < 4) {
            pcVar14 = (&PTR_anon_var_dwarf_76a4c_001ccd68)[lVar7 - LYXP_SET_SNODE_SET];
          }
          else {
            pcVar14 = (char *)0x0;
          }
          pcVar22 = "path operator";
          ecode = LYE_XPATH_INOP_1;
LAB_0017b094:
          ly_vlog(plVar28,ecode,LY_VLOG_NONE,(void *)0x0,pcVar22,pcVar14);
          return ~LYXP_SET_EMPTY;
        }
        _uStack_68 = (lys_module *)CONCAT44(mod_idx,(uint)uVar5);
        pcVar14 = strnchr((char *)plVar29,0x3a,uVar25);
        if (pcVar14 == (char *)0x0) {
          local_40 = (lys_module *)0x0;
        }
        else {
          pcVar14 = strnchr((char *)plVar29,0x3a,uVar25);
          uVar25 = (int)pcVar14 - (int)plVar29;
          plVar9 = moveto_resolve_model
                             ((char *)plVar29,(uint16_t)uVar25,
                              (ly_ctx *)**(undefined8 **)(local_48->name + 0x30),(lys_node *)0x0,0,
                              uVar33);
          if (plVar9 == (lys_module *)0x0) {
            plVar28 = (ly_ctx *)**(undefined8 **)(local_48->name + 0x30);
LAB_0017b0c1:
            ly_vlog(plVar28,LYE_XPATH_INMOD,LY_VLOG_NONE,(void *)0x0,(ulong)uVar25,plVar29);
            return ~LYXP_SET_EMPTY;
          }
          local_60 = (lys_module *)(plVar29->padding2 + (long)(int)uVar25 + -0x41);
          _uStack_68 = (lys_module *)CONCAT44(mod_idx,~uVar25 + uStack_68);
          local_40 = plVar9;
        }
        plVar27 = local_38;
        plVar12 = set_copy(local_38);
        plVar16 = local_48;
        lVar7 = moveto_node_alldesc(plVar12,(lyd_node *)local_48,"*",1,options);
        if (lVar7 != LYXP_SET_EMPTY) {
LAB_0017b013:
          if (plVar12 != (lyxp_set *)0x0) {
            set_free_content(plVar12);
            free(plVar12);
            return lVar7;
          }
          return lVar7;
        }
        iVar8 = moveto_union(plVar27,plVar12,(lyd_node *)plVar16,options);
        if (iVar8 != 0) {
          lVar7 = ~LYXP_SET_EMPTY;
          goto LAB_0017b013;
        }
        if (plVar12 != (lyxp_set *)0x0) {
          set_free_content(plVar12);
          free(plVar12);
        }
        local_58 = (lys_module *)CONCAT71(local_58._1_7_,1);
        if ((short)_uStack_68 == 1) {
          local_58 = (lys_module *)CONCAT71(local_58._1_7_,*(char *)&local_60->ctx != '*');
        }
        if (local_38->used != 0) {
          plVar9 = (lys_module *)(ulong)(uStack_68 & 0xffff);
          uVar13 = 0;
          plVar29 = local_40;
          _uStack_68 = plVar9;
          do {
            if (((local_38->val).nodes[uVar13].type == LYXP_NODE_ELEM) &&
               (plVar26 = (lyd_node *)((local_38->val).nodes[uVar13].node)->attr,
               plVar26 != (lyd_node *)0x0)) {
              bVar35 = false;
              do {
                if ((plVar29 == (lys_module *)0x0) ||
                   (*(lys_module **)&plVar26->attr->value_type == plVar29)) {
                  if ((char)local_58 != '\0') {
                    plVar3 = plVar26->next;
                    iVar8 = strncmp((char *)plVar3,(char *)local_60,(size_t)plVar9);
                    plVar29 = local_40;
                    if ((iVar8 != 0) ||
                       (plVar9->padding2[(long)((long)&plVar3[-1].schema + 6)] != '\0'))
                    goto LAB_0017a5cf;
                  }
                  if (bVar35) {
                    set_insert_node(local_38,plVar26,(local_38->val).nodes[uVar13].pos,
                                    LYXP_NODE_ATTR,(int)uVar13 + 1);
                    plVar29 = local_40;
                    plVar9 = _uStack_68;
                  }
                  else {
                    (local_38->val).nodes[uVar13].node = plVar26;
                    (local_38->val).nodes[uVar13].type = LYXP_NODE_ATTR;
                  }
                  uVar13 = (ulong)((int)uVar13 + 1);
                  bVar35 = true;
                }
LAB_0017a5cf:
                plVar26 = *(lyd_node **)&plVar26->validity;
              } while (plVar26 != (lyd_node *)0x0);
              plVar27 = local_38;
              if (!bVar35) goto LAB_0017a5ef;
            }
            else {
LAB_0017a5ef:
              plVar27 = local_38;
              set_remove_node(local_38,(uint32_t)uVar13);
              plVar29 = local_40;
              plVar9 = _uStack_68;
            }
          } while ((uint)uVar13 < plVar27->used);
        }
      }
    }
    plVar4 = local_80;
    exp_idx_00 = local_98;
    pcVar14 = print_token(local_80->tokens[*local_98]);
    ly_log_dbg(8,"%-27s %s %s[%u]","eval_node_test",pcVar22,pcVar14,
               (ulong)plVar4->expr_pos[*exp_idx_00]);
    plVar27 = local_38;
  }
  plVar4 = local_80;
  *exp_idx_00 = *exp_idx_00 + 1;
  while( true ) {
    uVar5 = plVar4->used;
    uVar6 = *exp_idx_00;
    if ((uVar5 <= uVar6) || (plVar4->tokens[uVar6] != LYXP_TOKEN_BRACK1)) break;
    lVar7 = eval_predicate(plVar4,exp_idx_00,(lyd_node *)local_48,local_88,plVar27,options,1);
    if (lVar7 != LYXP_SET_EMPTY) {
      return lVar7;
    }
  }
  goto LAB_0017a3d2;
LAB_00179892:
  (plVar27->val).nodes[iVar8].pos = 2;
  lVar34 = lVar34 + 1;
  uVar30 = 0;
  if (lVar34 == lVar20) goto LAB_0017a307;
  goto LAB_0017973e;
LAB_0017a307:
  lVar34 = 0xc;
  do {
    if (*(int *)((long)&((plVar27->val).nodes)->node + lVar34) == 2) {
      *(undefined4 *)((long)&((plVar27->val).nodes)->node + lVar34) = 1;
    }
    lVar34 = lVar34 + 0x10;
    lVar20 = lVar20 + -1;
    lVar7 = LYXP_SET_EMPTY;
  } while (lVar20 != 0);
switchD_00179c2f_caseD_0:
  if (lVar7 != LYXP_SET_EMPTY) {
    return lVar7;
  }
  lVar19 = local_80->tokens[*local_98];
  pcVar14 = "parsed";
  exp_idx = local_98;
  exp = local_80;
LAB_0017a38a:
  pcVar11 = print_token(lVar19);
  ly_log_dbg(8,"%-27s %s %s[%u]","eval_relative_location_path",pcVar14,pcVar11,
             (ulong)exp->expr_pos[*exp_idx]);
  uVar6 = *exp_idx + 1;
  *exp_idx = uVar6;
  uVar5 = exp->used;
LAB_0017a3d2:
  exp = local_80;
  exp_idx = local_98;
  if (uVar5 <= uVar6) {
    return LYXP_SET_EMPTY;
  }
  if (local_80->tokens[uVar6] != LYXP_TOKEN_OPERATOR_PATH) {
    return LYXP_SET_EMPTY;
  }
  all_desc = 0;
  if (local_80->tok_len[uVar6] != 1) {
    if (local_80->tok_len[uVar6] != 2) {
      __assert_fail("exp->tok_len[*exp_idx] == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x1c06,
                    "int eval_relative_location_path(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, struct lyxp_set *, int)"
                   );
    }
    all_desc = 1;
  }
  set = (lyxp_set *)(ulong)local_80->expr_pos[uVar6];
  pcVar14 = "Operator(Path)";
  ly_log_dbg(8,"%-27s %s %s[%u]","eval_relative_location_path",pcVar22);
  uVar5 = *exp_idx + 1;
  *exp_idx = uVar5;
  goto LAB_00179693;
}

Assistant:

static int
eval_relative_location_path(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
                            int all_desc, struct lyxp_set *set, int options)
{
    int attr_axis, ret;

    goto step;
    do {
        /* evaluate '/' or '//' */
        if (exp->tok_len[*exp_idx] == 1) {
            all_desc = 0;
        } else {
            assert(exp->tok_len[*exp_idx] == 2);
            all_desc = 1;
        }
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

step:
        /* Step */
        attr_axis = 0;
        switch (exp->tokens[*exp_idx]) {
        case LYXP_TOKEN_DOT:
            /* evaluate '.' */
            if (set && (options & LYXP_SNODE_ALL)) {
                ret = moveto_snode_self(set, (struct lys_node *)cur_node, all_desc, options);
            } else {
                ret = moveto_self(set, cur_node, all_desc, options);
            }
            if (ret) {
                return ret;
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_DDOT:
            /* evaluate '..' */
            if (set && (options & LYXP_SNODE_ALL)) {
                ret = moveto_snode_parent(set, (struct lys_node *)cur_node, all_desc, options);
            } else {
                ret = moveto_parent(set, cur_node, all_desc, options);
            }
            if (ret) {
                return ret;
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_AT:
            /* evaluate '@' */
            attr_axis = 1;
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);

            /* fall through */
        case LYXP_TOKEN_NAMETEST:
        case LYXP_TOKEN_NODETYPE:
            ret = eval_node_test(exp, exp_idx, cur_node, local_mod, attr_axis, all_desc, set, options);
            if (ret) {
                return ret;
            }

            while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
                ret = eval_predicate(exp, exp_idx, cur_node, local_mod, set, options, 1);
                if (ret) {
                    return ret;
                }
            }
            break;

        default:
            LOGINT(local_mod ? local_mod->ctx : NULL);
            return -1;
        }
    } while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH));

    return EXIT_SUCCESS;
}